

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O0

void lsp::LanguageService::toClient_notification_telemetry_event(json *params)

{
  element_type *this;
  undefined1 local_130 [152];
  undefined1 local_98 [8];
  Notification notification;
  json *params_local;
  
  notification.params_.param_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)params;
  jsonrpcpp::Parameter::Parameter((Parameter *)(local_130 + 0x40),params);
  jsonrpcpp::Notification::Notification
            ((Notification *)local_98,"telemetry/event",(Parameter *)(local_130 + 0x40));
  jsonrpcpp::Parameter::~Parameter((Parameter *)(local_130 + 0x40));
  this = std::__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )&ioHandler_);
  jsonrpcpp::Notification::to_json_abi_cxx11_((Notification *)local_130);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)(local_130 + 0x10),
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_130,-1,' ',false,strict);
  IOHandler::addMessageToSend(this,(string *)(local_130 + 0x10));
  std::__cxx11::string::~string((string *)(local_130 + 0x10));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_130);
  jsonrpcpp::Notification::~Notification((Notification *)local_98);
  return;
}

Assistant:

void lsp::LanguageService::toClient_notification_telemetry_event(const json &params)
{
    jsonrpcpp::Notification notification("telemetry/event", params);
    ioHandler_->addMessageToSend(notification.to_json().dump());
}